

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::find<char[2]>(raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                *this,key_arg<char[2]> *key)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  anon_union_8_1_a8a14541_for_iterator_1 aVar3;
  uint uVar4;
  iterator iVar5;
  ushort uVar6;
  iterator iVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  ctrl_t *pcVar11;
  ulong uVar12;
  undefined1 uVar13;
  ulong uVar14;
  long lVar15;
  __m128i match;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  
  uVar10 = std::_Hash_bytes("a",1,0xc70f6907);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar10;
  iVar5 = (iterator)(auVar16 * ZEXT816(0xde5fb9d2630458e9));
  pcVar2 = this->ctrl_;
  if (pcVar2 != (ctrl_t *)0x0) {
    uVar10 = this->capacity_;
    if ((uVar10 + 1 & uVar10) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar14 = (ulong)(iVar5.ctrl_ + (long)&(iVar5.field_1.slot_)->pair) >> 7 ^ (ulong)pcVar2 >> 0xc;
    uVar13 = SUB81(iVar5.ctrl_ + (long)&(iVar5.field_1.slot_)->pair,0);
    auVar16 = ZEXT216(CONCAT11(uVar13,uVar13) & 0x7f7f);
    auVar16 = pshuflw(auVar16,auVar16,0);
    aVar3 = (anon_union_8_1_a8a14541_for_iterator_1)this->slots_;
    lVar15 = 0;
    while( true ) {
      uVar14 = uVar14 & uVar10;
      pcVar1 = pcVar2 + uVar14;
      cVar8 = pcVar1[0xf];
      cVar18 = auVar16[0];
      auVar19[0] = -(cVar18 == *pcVar1);
      cVar20 = auVar16[1];
      auVar19[1] = -(cVar20 == pcVar1[1]);
      cVar21 = auVar16[2];
      auVar19[2] = -(cVar21 == pcVar1[2]);
      cVar22 = auVar16[3];
      auVar19[3] = -(cVar22 == pcVar1[3]);
      auVar19[4] = -(cVar18 == pcVar1[4]);
      auVar19[5] = -(cVar20 == pcVar1[5]);
      auVar19[6] = -(cVar21 == pcVar1[6]);
      auVar19[7] = -(cVar22 == pcVar1[7]);
      auVar19[8] = -(cVar18 == pcVar1[8]);
      auVar19[9] = -(cVar20 == pcVar1[9]);
      auVar19[10] = -(cVar21 == pcVar1[10]);
      auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
      auVar19[0xc] = -(cVar18 == pcVar1[0xc]);
      auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
      auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
      auVar19[0xf] = -(cVar22 == cVar8);
      uVar6 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
      pcVar11 = (ctrl_t *)(ulong)uVar6;
      if (uVar6 != 0) {
        uVar9 = (uint)uVar6;
        do {
          uVar4 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          uVar12 = uVar4 + uVar14 & uVar10;
          if ((aVar3.slot_[uVar12].pair.first._M_string_length == 1) &&
             (iVar7.field_1.slot_ = aVar3.slot_, iVar7.ctrl_ = (ctrl_t *)(aVar3.slot_ + uVar12),
             *aVar3.slot_[uVar12].pair.first._M_dataplus._M_p == 'a')) {
            return iVar7;
          }
          uVar9 = uVar9 - 1 & uVar9;
          pcVar11 = (ctrl_t *)(ulong)uVar9;
        } while (uVar9 != 0);
      }
      iVar5.field_1.slot_ = aVar3.slot_;
      iVar5.ctrl_ = pcVar11;
      auVar17[0] = -(*pcVar1 == -0x80);
      auVar17[1] = -(pcVar1[1] == -0x80);
      auVar17[2] = -(pcVar1[2] == -0x80);
      auVar17[3] = -(pcVar1[3] == -0x80);
      auVar17[4] = -(pcVar1[4] == -0x80);
      auVar17[5] = -(pcVar1[5] == -0x80);
      auVar17[6] = -(pcVar1[6] == -0x80);
      auVar17[7] = -(pcVar1[7] == -0x80);
      auVar17[8] = -(pcVar1[8] == -0x80);
      auVar17[9] = -(pcVar1[9] == -0x80);
      auVar17[10] = -(pcVar1[10] == -0x80);
      auVar17[0xb] = -(pcVar1[0xb] == -0x80);
      auVar17[0xc] = -(pcVar1[0xc] == -0x80);
      auVar17[0xd] = -(pcVar1[0xd] == -0x80);
      auVar17[0xe] = -(pcVar1[0xe] == -0x80);
      auVar17[0xf] = -(cVar8 == -0x80);
      if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar8 == -0x80)
      break;
      uVar14 = uVar14 + lVar15 + 0x10;
      lVar15 = lVar15 + 0x10;
    }
  }
  return iVar5;
}

Assistant:

iterator find(const key_arg<K>& key) {
        return find(key, this->hash(key));
    }